

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O3

size_t tool_header_cb(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  long lVar1;
  undefined8 *puVar2;
  FILE *__s;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  undefined8 uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  byte bVar14;
  size_t fnlen;
  undefined8 local_38;
  
  uVar13 = nmemb * size;
  uVar10 = (ulong)(uVar13 == 0);
  lVar1 = *(long *)(*(long *)((long)userdata + 8) + 0x18);
  if (lVar1 == 0) {
    return uVar10;
  }
  puVar2 = *userdata;
  if (((*(long *)(lVar1 + 0xb8) != 0) &&
      (__s = *(FILE **)(*(long *)((long)userdata + 8) + 0x10), __s != (FILE *)0x0)) &&
     (sVar5 = fwrite(ptr,size,nmemb,__s), sVar5 != uVar13)) {
    return sVar5;
  }
  if (uVar13 < 0x15) {
    return uVar13;
  }
  if (*(char *)((long)userdata + 0x10) == '\0') {
    return uVar13;
  }
  iVar3 = Curl_raw_nequal("Content-disposition:",(char *)ptr,0x14);
  if (iVar3 == 0) {
    return uVar13;
  }
  pbVar9 = (byte *)((long)ptr + uVar13);
  pbVar12 = (byte *)((long)ptr + 0x14);
LAB_00107dd4:
  bVar14 = *pbVar12;
  if (pbVar12 < pbVar9 && bVar14 != 0) {
    ppuVar6 = __ctype_b_loc();
    do {
      pbVar11 = pbVar12 + 1;
      if (((*(byte *)((long)*ppuVar6 + (ulong)bVar14 * 2 + 1) & 4) != 0) ||
         (bVar14 = *pbVar11, pbVar12 = pbVar11, bVar14 == 0)) break;
    } while (pbVar11 < pbVar9);
  }
  if (pbVar9 + -9 < pbVar12) {
    return uVar13;
  }
  if (pbVar12[8] != 0x3d || *(long *)pbVar12 != 0x656d616e656c6966) {
    for (; (pbVar12 < pbVar9 && (*pbVar12 != 0x3b)); pbVar12 = pbVar12 + 1) {
    }
    goto LAB_00107dd4;
  }
  pcVar7 = strstr((char *)((long)ptr + 0x14),"filename*=");
  if (pcVar7 == (char *)0x0) {
    pbVar12 = pbVar12 + 9;
    pbVar9 = (byte *)malloc((long)ptr + (uVar13 - (long)pbVar12) + 1);
    if (pbVar9 == (byte *)0x0) {
      return uVar10;
    }
    sVar5 = (long)ptr + (uVar13 - (long)pbVar12);
    memcpy(pbVar9,pbVar12,sVar5);
    pbVar9[sVar5] = 0;
    bVar14 = *pbVar9;
    if ((bVar14 == 0x27) || (uVar4 = 0x3b, pbVar12 = pbVar9, bVar14 == 0x22)) {
      pbVar12 = pbVar9 + 1;
      uVar4 = (uint)bVar14;
    }
    pcVar7 = strrchr((char *)pbVar9,0x2f);
    if (pcVar7 == (char *)0x0) {
LAB_00107f93:
      pcVar7 = strrchr((char *)pbVar12,0x5c);
      if (pcVar7 == (char *)0x0) {
        bVar14 = *pbVar12;
        pbVar11 = pbVar12;
        goto joined_r0x00107fce;
      }
      bVar14 = pcVar7[1];
      if (bVar14 != 0) {
        pbVar12 = (byte *)(pcVar7 + 1);
        pbVar11 = pbVar12;
        do {
          if ((bVar14 == 0x5c) && (pbVar12[1] != 0)) {
            pbVar12 = pbVar12 + 1;
          }
          else if (uVar4 == (int)(char)bVar14) break;
          bVar14 = pbVar12[1];
          pbVar12 = pbVar12 + 1;
joined_r0x00107fce:
        } while (bVar14 != 0);
        *pbVar12 = 0;
        pcVar7 = strchr((char *)pbVar11,0xd);
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
        }
        pcVar7 = strchr((char *)pbVar11,10);
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
        }
        if (pbVar9 != pbVar11) {
          sVar5 = strlen((char *)pbVar11);
          memmove(pbVar9,pbVar11,sVar5 + 1);
        }
        goto LAB_00107eeb;
      }
    }
    else if (pcVar7[1] != '\0') {
      pbVar12 = (byte *)(pcVar7 + 1);
      goto LAB_00107f93;
    }
    free(pbVar9);
  }
  else {
    local_38 = 0;
    pcVar7 = strstr(pcVar7 + 10,"UTF-8\'\'");
    uVar8 = curl_easy_init();
    sVar5 = strlen(pcVar7 + 7);
    pbVar9 = (byte *)curl_easy_unescape(uVar8,pcVar7 + 7,sVar5 & 0xffffffff,&local_38);
    curl_easy_cleanup(uVar8);
    curl_mfprintf(_stderr,"STR=%s\n\n",pbVar9);
LAB_00107eeb:
    if (pbVar9 != (byte *)0x0) {
      *puVar2 = pbVar9;
      *(undefined4 *)(puVar2 + 1) = 0x10101;
      puVar2[2] = 0;
      *(undefined1 *)((long)userdata + 0x10) = 0;
      uVar10 = uVar13;
    }
  }
  return uVar10;
}

Assistant:

size_t tool_header_cb(void *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct HdrCbData *hdrcbdata = userdata;
  struct OutStruct *outs = hdrcbdata->outs;
  struct OutStruct *heads = hdrcbdata->heads;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char*)ptr + cb;

  int encoded_file_name = FALSE;
  
  /*
   * Once that libcurl has called back tool_header_cb() the returned value
   * is checked against the amount that was intended to be written, if
   * it does not match then it fails with CURLE_WRITE_ERROR. So at this
   * point returning a value different from sz*nmemb indicates failure.
   */
  size_t failure = (size * nmemb) ? 0 : 1;

  if(!heads->config)
    return failure;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(heads->config, "Header data exceeds single call write limit!\n");
    return failure;
  }
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(heads->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
  }

  /*
   * This callback sets the filename where output shall be written when
   * curl options --remote-name (-O) and --remote-header-name (-J) have
   * been simultaneously given and additionally server returns an HTTP
   * Content-Disposition header specifying a filename property.
   */

  if(hdrcbdata->honor_cd_filename &&
     (cb > 20) && checkprefix("Content-disposition:", str)) {
    const char *p = str + 20;

    /* look for the 'filename=' parameter
       (encoded filenames (*=) are not supported) */
    for(;;) {
      char *filename;
      size_t len;
	  char* enc_ptr;	  

      while(*p && (p < end) && !ISALPHA(*p))
        p++;
      if(p > end - 9)
        break;

      if(memcmp(p, "filename=", 9)) {
        /* no match, find next parameter */
        while((p < end) && (*p != ';'))
          p++;
        continue;
      }
      p += 9;

	  enc_ptr = strstr(str + 20, "filename*=");
      if (enc_ptr) {
	  	char* fntmp = NULL;
		size_t fnlen = 0;
        enc_ptr += 10;

		fntmp = strstr(enc_ptr, "UTF-8''");
				
		if (fntmp != NULL) 
		{
			CURL* curl;
			curl = curl_easy_init();
			filename = curl_easy_unescape(curl,  fntmp + 7, strlen(fntmp + 7),&fnlen);
			curl_easy_cleanup(curl);
		}
        encoded_file_name = TRUE;

		//filename = strdup
		fprintf(stderr, "STR=%s\n\n", filename);
      }
	  
      /* this expression below typecasts 'cb' only to avoid
         warning: signed and unsigned type in conditional expression
      */
      len = (ssize_t)cb - (p - str);
	  if (encoded_file_name == FALSE)
		filename = parse_filename(p, len);

      if(filename) {
        outs->filename = filename;
        outs->alloc_filename = TRUE;
        outs->is_cd_filename = TRUE;
        outs->s_isreg = TRUE;
        outs->fopened = FALSE;
        outs->stream = NULL;
        hdrcbdata->honor_cd_filename = FALSE;
        break;
      }
      else
        return failure;
    }
  }

  return cb;
}